

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satSolver2.h
# Opt level: O0

int sat_solver2_add_xor(sat_solver2 *pSat,int iVarA,int iVarB,int iVarC,int fCompl,int fMark,int Id)

{
  int iVar1;
  lit local_30;
  int Cid;
  lit Lits [3];
  int fMark_local;
  int fCompl_local;
  int iVarC_local;
  int iVarB_local;
  int iVarA_local;
  sat_solver2 *pSat_local;
  
  Lits[1] = fMark;
  Lits[2] = fCompl;
  if (((-1 < iVarA) && (-1 < iVarB)) && (-1 < iVarC)) {
    local_30 = toLitCond(iVarA,(uint)((fCompl != 0 ^ 0xffU) & 1));
    Cid = toLitCond(iVarB,1);
    Lits[0] = toLitCond(iVarC,1);
    iVar1 = sat_solver2_addclause(pSat,&local_30,Lits + 1,Id);
    if (Lits[1] != 0) {
      clause2_set_partA(pSat,iVar1,1);
    }
    local_30 = toLitCond(iVarA,(uint)((Lits[2] != 0 ^ 0xffU) & 1));
    Cid = toLitCond(iVarB,0);
    Lits[0] = toLitCond(iVarC,0);
    iVar1 = sat_solver2_addclause(pSat,&local_30,Lits + 1,Id);
    if (Lits[1] != 0) {
      clause2_set_partA(pSat,iVar1,1);
    }
    local_30 = toLitCond(iVarA,Lits[2]);
    Cid = toLitCond(iVarB,1);
    Lits[0] = toLitCond(iVarC,0);
    iVar1 = sat_solver2_addclause(pSat,&local_30,Lits + 1,Id);
    if (Lits[1] != 0) {
      clause2_set_partA(pSat,iVar1,1);
    }
    local_30 = toLitCond(iVarA,Lits[2]);
    Cid = toLitCond(iVarB,0);
    Lits[0] = toLitCond(iVarC,1);
    iVar1 = sat_solver2_addclause(pSat,&local_30,Lits + 1,Id);
    if (Lits[1] != 0) {
      clause2_set_partA(pSat,iVar1,1);
    }
    return 4;
  }
  __assert_fail("iVarA >= 0 && iVarB >= 0 && iVarC >= 0",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bsat/satSolver2.h"
                ,0x143,"int sat_solver2_add_xor(sat_solver2 *, int, int, int, int, int, int)");
}

Assistant:

static inline int sat_solver2_add_xor( sat_solver2 * pSat, int iVarA, int iVarB, int iVarC, int fCompl, int fMark, int Id )
{
    lit Lits[3];
    int Cid;
    assert( iVarA >= 0 && iVarB >= 0 && iVarC >= 0 );

    Lits[0] = toLitCond( iVarA, !fCompl );
    Lits[1] = toLitCond( iVarB, 1 );
    Lits[2] = toLitCond( iVarC, 1 );
    Cid = sat_solver2_addclause( pSat, Lits, Lits + 3, Id );
    if ( fMark )
        clause2_set_partA( pSat, Cid, 1 );

    Lits[0] = toLitCond( iVarA, !fCompl );
    Lits[1] = toLitCond( iVarB, 0 );
    Lits[2] = toLitCond( iVarC, 0 );
    Cid = sat_solver2_addclause( pSat, Lits, Lits + 3, Id );
    if ( fMark )
        clause2_set_partA( pSat, Cid, 1 );

    Lits[0] = toLitCond( iVarA, fCompl );
    Lits[1] = toLitCond( iVarB, 1 );
    Lits[2] = toLitCond( iVarC, 0 );
    Cid = sat_solver2_addclause( pSat, Lits, Lits + 3, Id );
    if ( fMark )
        clause2_set_partA( pSat, Cid, 1 );

    Lits[0] = toLitCond( iVarA, fCompl );
    Lits[1] = toLitCond( iVarB, 0 );
    Lits[2] = toLitCond( iVarC, 1 );
    Cid = sat_solver2_addclause( pSat, Lits, Lits + 3, Id );
    if ( fMark )
        clause2_set_partA( pSat, Cid, 1 );
    return 4;
}